

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

symbol * Symbol_Nth(int n)

{
  if ((0 < n && x2a != (s_x2 *)0x0) && (n <= x2a->count)) {
    return x2a->tbl[(ulong)(uint)n - 1].data;
  }
  return (symbol *)0x0;
}

Assistant:

struct symbol *Symbol_Nth(int n)
{
  struct symbol *data;
  if( x2a && n>0 && n<=x2a->count ){
    data = x2a->tbl[n-1].data;
  }else{
    data = 0;
  }
  return data;
}